

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall IlmThread_2_5::anon_unknown_5::DefaultWorkerThread::run(DefaultWorkerThread *this)

{
  bool bVar1;
  reference ppTVar2;
  void *in_RSI;
  Mutex *in_RDI;
  TaskGroup *taskGroup;
  Task *task;
  Lock taskLock;
  Data *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  Semaphore *in_stack_ffffffffffffffe0;
  Data *this_00;
  
  Semaphore::post(in_stack_ffffffffffffffe0);
  do {
    Semaphore::wait(*(Semaphore **)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10),in_RSI);
    in_RSI = (void *)(*(long *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10) + 0x28);
    Lock::Lock((Lock *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,
               SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
    bVar1 = std::vector<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>::empty
                      ((vector<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (bVar1) {
      bVar1 = DefaultWorkData::stopped((DefaultWorkData *)0x10b792);
      if (!bVar1) goto LAB_0010b7ae;
      iVar3 = 3;
    }
    else {
      ppTVar2 = std::vector<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>::back
                          ((vector<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_> *)
                           in_stack_ffffffffffffffb0);
      this_00 = (Data *)*ppTVar2;
      std::vector<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>::pop_back
                ((vector<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_> *)0x10b713);
      Lock::release((Lock *)in_stack_ffffffffffffffb0);
      Task::group((Task *)this_00);
      in_stack_ffffffffffffffb0 = this_00;
      (**(code **)(*(long *)this_00 + 0x10))();
      if (in_stack_ffffffffffffffb0 != (Data *)0x0) {
        (**(code **)(*(long *)in_stack_ffffffffffffffb0 + 8))();
      }
      TaskGroup::Data::removeTask(in_stack_ffffffffffffffb0);
LAB_0010b7ae:
      iVar3 = 0;
    }
    Lock::~Lock((Lock *)in_stack_ffffffffffffffb0);
    if (iVar3 != 0) {
      return;
    }
    in_stack_ffffffffffffffc4 = 0;
  } while( true );
}

Assistant:

void
DefaultWorkerThread::run ()
{
    //
    // Signal that the thread has started executing
    //

    _data->threadSemaphore.post();

    while (true)
    {
        //
        // Wait for a task to become available
        //

        _data->taskSemaphore.wait();

        {
            Lock taskLock (_data->taskMutex);
    
            //
            // If there is a task pending, pop off the next task in the FIFO
            //

            if (!_data->tasks.empty())
            {
                Task* task = _data->tasks.back();
                _data->tasks.pop_back();
                taskLock.release();

                TaskGroup* taskGroup = task->group();
                task->execute();

                delete task;

                taskGroup->_data->removeTask ();
            }
            else if (_data->stopped())
            {
                break;
            }
        }
    }
}